

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoStore<v128,v128>(Thread *this,Instr instr,Ptr *out_trap)

{
  Store *pSVar1;
  v128 val_00;
  bool bVar2;
  RefVec *this_00;
  const_reference pvVar3;
  Memory *pMVar4;
  long lVar5;
  u64 uVar6;
  string local_a8;
  Ptr local_88;
  u64 local_6c;
  uint8_t local_64 [8];
  Enum local_5c;
  u64 local_58;
  u64 offset;
  v128 val;
  undefined1 local_38 [8];
  Ptr memory;
  Ptr *out_trap_local;
  Thread *this_local;
  
  pSVar1 = this->store_;
  memory.root_index_ = (Index)out_trap;
  this_00 = Instance::memories(this->inst_);
  pvVar3 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (this_00,(ulong)instr.field_2.imm_u32);
  val.v._8_8_ = pvVar3->index;
  RefPtr<wabt::interp::Memory>::RefPtr
            ((RefPtr<wabt::interp::Memory> *)local_38,pSVar1,(Ref)val.v._8_8_);
  _offset = Pop<v128>(this);
  local_58 = PopPtr(this,(Ptr *)local_38);
  pMVar4 = RefPtr<wabt::interp::Memory>::operator->((RefPtr<wabt::interp::Memory> *)local_38);
  val_00.v = _offset;
  local_6c = offset;
  local_64[0] = val.v[0];
  local_64[1] = val.v[1];
  local_64[2] = val.v[2];
  local_64[3] = val.v[3];
  local_64[4] = val.v[4];
  local_64[5] = val.v[5];
  local_64[6] = val.v[6];
  local_64[7] = val.v[7];
  _offset = val_00.v;
  local_5c = (Enum)Memory::Store<v128>(pMVar4,local_58,(ulong)instr.field_2.imm_u32x2.snd,val_00);
  bVar2 = Failed((Result)local_5c);
  if (bVar2) {
    pSVar1 = this->store_;
    lVar5 = local_58 + instr.field_2.imm_u32x2.snd;
    pMVar4 = RefPtr<wabt::interp::Memory>::operator->((RefPtr<wabt::interp::Memory> *)local_38);
    uVar6 = Memory::ByteSize(pMVar4);
    StringPrintf_abi_cxx11_
              (&local_a8,"out of bounds memory access: access at %lu+%zd >= max value %lu",lVar5,
               0x10,uVar6);
    Trap::New(&local_88,pSVar1,&local_a8,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=
              ((RefPtr<wabt::interp::Trap> *)memory.root_index_,&local_88);
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  else {
    this_local._4_4_ = Ok;
  }
  RefPtr<wabt::interp::Memory>::~RefPtr((RefPtr<wabt::interp::Memory> *)local_38);
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoStore(Instr instr, Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  V val = static_cast<V>(Pop<T>());
  u64 offset = PopPtr(memory);
  TRAP_IF(Failed(memory->Store(offset, instr.imm_u32x2.snd, val)),
          StringPrintf("out of bounds memory access: access at %" PRIu64
                       "+%" PRIzd " >= max value %" PRIu64,
                       offset + instr.imm_u32x2.snd, sizeof(V),
                       memory->ByteSize()));
  return RunResult::Ok;
}